

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O1

void __thiscall cfd::core::Serializer::AddDirectBytes(Serializer *this,ByteData *buffer)

{
  pointer __src;
  CfdException *this_00;
  ulong __n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  undefined1 local_40 [32];
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_58,&buffer->data_);
  __src = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  __n = (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (__n >> 0x20 == 0) {
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start &&
        local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      CheckNeedSize(this,(uint32_t)__n);
      memcpy((this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start + this->offset_,__src,__n);
      this->offset_ = this->offset_ + (uint32_t)__n;
    }
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_40._0_8_ = "cfdcore_bytedata.cpp";
  local_40._8_4_ = 0x1a6;
  local_40._16_8_ = "AddDirectBytes";
  logger::log<>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"It exceeds the handling size.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"It exceeds the handling size.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Serializer::AddDirectBytes(const ByteData& buffer) {
  auto buf = buffer.GetBytes();
  if (buf.size() > std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "It exceeds the handling size.");
    throw CfdException(kCfdIllegalStateError, "It exceeds the handling size.");
  }
  AddDirectBytes(buf.data(), static_cast<uint32_t>(buf.size()));
}